

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

void Undo_Justification(FIELD *field,WINDOW_conflict *win)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int len;
  char *bp;
  WINDOW_conflict *win_local;
  FIELD *field_local;
  
  pcVar2 = Get_Start_Of_Data(field->buf,field->drows * field->dcols);
  pcVar3 = After_End_Of_Data(field->buf,field->drows * field->dcols);
  iVar1 = (int)pcVar3 - (int)pcVar2;
  if (0 < iVar1) {
    if (win == (WINDOW_conflict *)0x0) {
      __assert_fail("win != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/form/frm_driver.c"
                    ,0x31c,"void Undo_Justification(FIELD *, WINDOW *)");
    }
    wmove(win,0);
    waddnstr(win,pcVar2,iVar1);
  }
  return;
}

Assistant:

static void Undo_Justification(FIELD  * field, WINDOW * win)
{
  char *bp;
  int len;

  bp  = Get_Start_Of_Data(field->buf,Buffer_Length(field));
  len = (int)(After_End_Of_Data(field->buf,Buffer_Length(field))-bp);

  if (len>0)
    {
      assert(win != 0);
      wmove(win,0,0);
      waddnstr(win,bp,len);
    }
}